

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O1

json * __thiscall
argo::json::insert(json *this,string *name,
                  unique_ptr<argo::json,_std::default_delete<argo::json>_> *j)

{
  json *pjVar1;
  _Head_base<0UL,_argo::json_*,_false> _Var2;
  json_exception *this_00;
  char *json_type_name;
  pointer *__ptr;
  _Head_base<0UL,_argo::json_*,_false> local_18;
  
  if (this->m_type == object_e) {
    pjVar1 = (j->_M_t).super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>._M_t.
             super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
             super__Head_base<0UL,_argo::json_*,_false>._M_head_impl;
    (j->_M_t).super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>._M_t.
    super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
    super__Head_base<0UL,_argo::json_*,_false>._M_head_impl = (json *)0x0;
    local_18._M_head_impl = pjVar1;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<argo::json,std::default_delete<argo::json>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<argo::json,std::default_delete<argo::json>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<argo::json,std::default_delete<argo::json>>>>>
    ::
    _M_emplace_unique<std::__cxx11::string_const&,std::unique_ptr<argo::json,std::default_delete<argo::json>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<argo::json,std::default_delete<argo::json>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<argo::json,std::default_delete<argo::json>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<argo::json,std::default_delete<argo::json>>>>>
                *)&(this->m_value).u_object,name,
               (unique_ptr<argo::json,_std::default_delete<argo::json>_> *)&local_18);
    _Var2._M_head_impl = local_18._M_head_impl;
    if (local_18._M_head_impl != (json *)0x0) {
      ~json(local_18._M_head_impl);
      operator_delete(_Var2._M_head_impl);
    }
    return pjVar1;
  }
  this_00 = (json_exception *)__cxa_allocate_exception(0xd8);
  json_type_name = get_instance_type_name(this);
  json_exception::json_exception(this_00,not_an_object_e,json_type_name);
  __cxa_throw(this_00,&json_exception::typeinfo,std::exception::~exception);
}

Assistant:

const json &json::insert(const string &name, unique_ptr<json> j)
{
    if (m_type == object_e)
    {
        json *r;
        m_value.u_object.emplace(name, unique_ptr<json>(r = j.release()));
        return *r;
    }
    else
    {
        throw json_exception(json_exception::not_an_object_e, get_instance_type_name());
    }
}